

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

_Bool sysbvm_io_writeWholeFileNamedWithByteArray(sysbvm_tuple_t filename,sysbvm_tuple_t content)

{
  char *__filename;
  FILE *__s;
  size_t sVar1;
  _Bool _Var2;
  
  __filename = sysbvm_tuple_bytesToCString(filename);
  __s = fopen(__filename,"wb");
  if (__s == (FILE *)0x0) {
    _Var2 = false;
  }
  else {
    sysbvm_tuple_bytesToCStringFree(__filename);
    _Var2 = true;
    if (((content & 0xf) == 0 && content != 0) && ((*(uint *)(content + 8) & 0x300) == 0x200)) {
      sVar1 = fwrite((void *)(content + 0x10),(ulong)*(uint *)(content + 0xc),1,__s);
      _Var2 = sVar1 == 1;
    }
    fclose(__s);
  }
  return _Var2;
}

Assistant:

SYSBVM_API bool sysbvm_io_writeWholeFileNamedWithByteArray(sysbvm_tuple_t filename, sysbvm_tuple_t content)
{
    char *outputFileName = sysbvm_tuple_bytesToCString(filename);
#ifdef _WIN32
    FILE *outputFile = NULL;
    if(fopen_s(&outputFile, outputFileName, "wb"))
        return false;
#else
    FILE *outputFile = fopen(outputFileName, "wb");
#endif
    if(!outputFile)
        return false;
    sysbvm_tuple_bytesToCStringFree(outputFileName);

    bool success = true;
    if(sysbvm_tuple_isBytes(content))
    {
        size_t contentSize = sysbvm_tuple_getSizeInBytes(content);
        success = fwrite(SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(content)->bytes, contentSize, 1, outputFile) == 1;
    }
    fclose(outputFile);

    return success;
}